

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::python::ContainsPythonKeyword(python *this,string_view module_name)

{
  char **ppcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  tokens;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_38;
  
  local_38.text_._M_str = (char *)module_name._M_len;
  local_38.delimiter_.c_ = '.';
  local_38.text_._M_len = (size_t)this;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
            (&tokens,&local_38);
  lVar3 = -1;
  lVar4 = 0;
  do {
    lVar2 = (long)(int)((ulong)((long)tokens.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)tokens.
                                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
    lVar3 = lVar3 + 1;
    if (lVar2 <= lVar3) break;
    ppcVar1 = std::
              __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                        (kKeywords,kKeywordsEnd,
                         (long)&(tokens.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar4);
    lVar4 = lVar4 + 0x10;
  } while (ppcVar1 == (char **)kKeywordsEnd);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&tokens.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return lVar3 < lVar2;
}

Assistant:

bool ContainsPythonKeyword(absl::string_view module_name) {
  std::vector<absl::string_view> tokens = absl::StrSplit(module_name, '.');
  for (int i = 0; i < static_cast<int>(tokens.size()); ++i) {
    if (std::find(kKeywords, kKeywordsEnd, tokens[i]) != kKeywordsEnd) {
      return true;
    }
  }
  return false;
}